

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O2

int main(int argc,char **argv)

{
  int height;
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLFWvidmode *pGVar4;
  GLFWvidmode *pGVar5;
  char *pcVar6;
  GLFWmonitor *pGVar7;
  GLFWmonitor *pGVar8;
  GLFWwindow *handle;
  bool bVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  int count_1;
  int count_2;
  int local_84;
  uint local_80;
  uint local_7c;
  uint local_78 [2];
  int count;
  float local_6c;
  float xscale;
  int height_mm;
  int width_mm;
  int y;
  GLFWvidmode *local_58;
  GLFWmonitor **local_50;
  long local_48;
  GLFWmonitor *local_40;
  GLFWvidmode *local_38;
  
  bVar1 = true;
  do {
    bVar9 = bVar1;
    iVar2 = getopt(argc,argv,"th");
    bVar1 = false;
  } while (iVar2 == 0x74);
  if (iVar2 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar2 = glfwInit();
    if (iVar2 == 0) goto LAB_00113f7a;
    local_50 = glfwGetMonitors(&count);
    lVar10 = 0;
    while (lVar10 < count) {
      pGVar8 = local_50[lVar10];
      local_48 = lVar10;
      if (bVar9) {
        pGVar4 = glfwGetVideoMode(pGVar8);
        pGVar5 = glfwGetVideoModes(pGVar8,&count_2);
        glfwGetMonitorPos(pGVar8,&count_1,&y);
        glfwGetMonitorPhysicalSize(pGVar8,&width_mm,&height_mm);
        glfwGetMonitorContentScale(pGVar8,&xscale,&local_6c);
        pcVar6 = glfwGetMonitorName(pGVar8);
        pGVar7 = glfwGetPrimaryMonitor();
        pcVar11 = "secondary";
        if (pGVar7 == pGVar8) {
          pcVar11 = "primary";
        }
        printf("Name: %s (%s)\n",pcVar6,pcVar11);
        format_mode(pGVar4);
        printf("Current mode: %s\n",format_mode::buffer);
        printf("Virtual position: %i %i\n",(ulong)(uint)count_1,(ulong)(uint)y);
        printf("Content scale: %f %f\n",(double)xscale,(double)local_6c);
        printf("Physical size: %i x %i mm (%0.2f dpi)\n",
               (double)(((float)pGVar4->width * 25.4) / (float)width_mm),(ulong)(uint)width_mm,
               (ulong)(uint)height_mm);
        puts("Modes:");
        for (uVar13 = 0; (long)uVar13 < (long)count_2; uVar13 = uVar13 + 1) {
          format_mode(pGVar5);
          printf("%3u: %s",uVar13 & 0xffffffff,format_mode::buffer);
          iVar2 = bcmp(pGVar4,pGVar5,0x18);
          if (iVar2 == 0) {
            printf(" (current mode)");
          }
          putchar(10);
          pGVar5 = pGVar5 + 1;
        }
      }
      else {
        local_38 = glfwGetVideoModes(pGVar8,&count_1);
        local_40 = pGVar8;
        for (uVar13 = 0; pGVar4 = local_38, pGVar8 = local_40, (long)uVar13 < (long)count_1;
            uVar13 = uVar13 + 1) {
          pGVar5 = local_38 + uVar13;
          glfwWindowHint(0x21001,local_38[uVar13].redBits);
          glfwWindowHint(0x21002,pGVar4[uVar13].greenBits);
          glfwWindowHint(0x21003,pGVar4[uVar13].blueBits);
          glfwWindowHint(0x2100f,pGVar4[uVar13].refreshRate);
          pcVar6 = glfwGetMonitorName(pGVar8);
          local_58 = pGVar5;
          format_mode(pGVar5);
          printf("Testing mode %u on monitor %s: %s\n",uVar13 & 0xffffffff,pcVar6,
                 format_mode::buffer);
          iVar2 = pGVar4[uVar13].width;
          height = pGVar4[uVar13].height;
          pGVar8 = glfwGetPrimaryMonitor();
          handle = glfwCreateWindow(iVar2,height,"Video Mode Test",pGVar8,(GLFWwindow *)0x0);
          pGVar4 = local_58;
          if (handle == (GLFWwindow *)0x0) {
            format_mode(local_58);
            printf("Failed to enter mode %u: %s\n",uVar13 & 0xffffffff,format_mode::buffer);
          }
          else {
            glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
            glfwSetKeyCallback(handle,key_callback);
            glfwMakeContextCurrent(handle);
            gladLoadGLLoader(glfwGetProcAddress);
            glfwSwapInterval(1);
            glfwSetTime(0.0);
            while (dVar14 = glfwGetTime(), dVar14 < 5.0) {
              (*glad_glClear)(0x4000);
              glfwSwapBuffers(handle);
              glfwPollEvents();
              iVar2 = glfwWindowShouldClose(handle);
              if (iVar2 != 0) {
                puts("User terminated program");
                goto LAB_00113f8e;
              }
            }
            (*glad_glGetIntegerv)(0xd52,(GLint *)&local_80);
            (*glad_glGetIntegerv)(0xd53,(GLint *)&local_7c);
            (*glad_glGetIntegerv)(0xd54,(GLint *)local_78);
            glfwGetWindowSize(handle,&count_2,&local_84);
            if (local_80 == pGVar4->redBits) {
              uVar12 = (ulong)(uint)pGVar4->greenBits;
              uVar3 = pGVar4->blueBits;
              if ((local_7c != pGVar4->greenBits) ||
                 (uVar12 = (ulong)local_7c, local_78[0] != uVar3)) goto LAB_00113f03;
            }
            else {
              uVar12 = (ulong)(uint)pGVar4->greenBits;
              uVar3 = pGVar4->blueBits;
LAB_00113f03:
              printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",(ulong)local_80,
                     (ulong)local_7c,(ulong)local_78[0],(ulong)(uint)pGVar4->redBits,uVar12,uVar3);
            }
            if (local_84 != pGVar4->height || count_2 != pGVar4->width) {
              printf("*** Size mismatch: %ix%i instead of %ix%i\n");
            }
            puts("Closing window");
            glfwDestroyWindow(handle);
            glfwPollEvents();
          }
        }
      }
      lVar10 = local_48 + 1;
    }
LAB_00113f8e:
    glfwTerminate();
  }
  else {
    if (iVar2 != 0x68) {
      usage();
LAB_00113f7a:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, count, mode = LIST_MODE;
    GLFWmonitor** monitors;

    while ((ch = getopt(argc, argv, "th")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 't':
                mode = TEST_MODE;
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitors = glfwGetMonitors(&count);

    for (i = 0;  i < count;  i++)
    {
        if (mode == LIST_MODE)
            list_modes(monitors[i]);
        else if (mode == TEST_MODE)
            test_modes(monitors[i]);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}